

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

int __thiscall jrtplib::RTPPacketBuilder::Init(RTPPacketBuilder *this,size_t max)

{
  uint8_t *puVar1;
  int iVar2;
  
  if (this->init == false) {
    if (max == 0) {
      iVar2 = -0x13;
    }
    else {
      this->maxpacksize = max;
      puVar1 = (uint8_t *)operator_new__(max,(this->super_RTPMemoryObject).mgr,9);
      this->buffer = puVar1;
      if (puVar1 == (uint8_t *)0x0) {
        iVar2 = -1;
      }
      else {
        this->packetlength = 0;
        iVar2 = 0;
        CreateNewSSRC(this,0);
        this->deftsset = false;
        this->defptset = false;
        this->defmarkset = false;
        this->numcsrcs = 0;
        this->init = true;
      }
    }
  }
  else {
    iVar2 = -0xc;
  }
  return iVar2;
}

Assistant:

int RTPPacketBuilder::Init(size_t max)
{
	if (init)
		return ERR_RTP_PACKBUILD_ALREADYINIT;
	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	
	maxpacksize = max;
	buffer = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t [max];
	if (buffer == 0)
		return ERR_RTP_OUTOFMEM;
	packetlength = 0;
	
	CreateNewSSRC(0);

	deftsset = false;
	defptset = false;
	defmarkset = false;
		
	numcsrcs = 0;
	
	init = true;
	return 0;
}